

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Encode
          (UnderwaterAcousticEmitterSystem *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference DTB;
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  UnderwaterAcousticEmitterSystem *this_local;
  
  pKVar2 = KDataStream::operator<<(stream,this->m_ui8EmitterSystemDataLength);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumBeams);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding1);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_AES).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_Location).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
            ::begin(&this->m_vUAEB);
  local_28._M_current =
       (UnderwaterAcousticEmitterBeam *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
       ::end(&this->m_vUAEB);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    DTB = __gnu_cxx::
          __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
          ::operator*(&citrEnd);
    DATA_TYPE::operator<<(stream,&DTB->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui8EmitterSystemDataLength
           << m_ui8NumBeams
           << m_ui16Padding1
           << KDIS_STREAM m_AES
           << KDIS_STREAM m_Location;

    vector<UnderwaterAcousticEmitterBeam>::const_iterator citr = m_vUAEB.begin();
    vector<UnderwaterAcousticEmitterBeam>::const_iterator citrEnd = m_vUAEB.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << KDIS_STREAM *citr;
    }
}